

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smodels.cpp
# Opt level: O3

void __thiscall Potassco::SmodelsInput::matchSum(SmodelsInput *this,RuleBuilder *rule,bool weights)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Atom_t AVar5;
  WeightLit_t *pWVar6;
  undefined7 in_register_00000011;
  uint uVar7;
  long lVar8;
  
  uVar2 = ProgramReader::matchPos(&this->super_ProgramReader,0xffffffff,"unsigned integer expected")
  ;
  uVar3 = ProgramReader::matchPos(&this->super_ProgramReader,0xffffffff,"unsigned integer expected")
  ;
  uVar4 = ProgramReader::matchPos(&this->super_ProgramReader,0xffffffff,"unsigned integer expected")
  ;
  uVar7 = uVar2;
  uVar1 = uVar4;
  if ((int)CONCAT71(in_register_00000011,weights) != 0) {
    uVar7 = uVar3;
    uVar1 = uVar2;
  }
  RuleBuilder::startSum(rule,uVar1);
  if (uVar7 == 0) {
    if (weights) {
      RuleBuilder::wlits_begin(rule);
      return;
    }
  }
  else {
    if (!weights) {
      uVar4 = uVar3;
    }
    do {
      AVar5 = ProgramReader::matchAtom(&this->super_ProgramReader,"atom expected");
      uVar2 = uVar4 - 1;
      uVar1 = -AVar5;
      if (uVar4 == 0) {
        uVar2 = 0;
        uVar1 = AVar5;
      }
      RuleBuilder::addGoal(rule,(WeightLit_t)((ulong)uVar1 | 0x100000000));
      uVar7 = uVar7 - 1;
      uVar4 = uVar2;
    } while (uVar7 != 0);
    if (weights) {
      pWVar6 = RuleBuilder::wlits_begin(rule);
      lVar8 = 0;
      do {
        uVar7 = ProgramReader::matchPos
                          (&this->super_ProgramReader,0xffffffff,"non-negative weight expected");
        *(uint *)((long)&pWVar6->weight + lVar8) = uVar7;
        lVar8 = lVar8 + 8;
      } while ((ulong)uVar3 << 3 != lVar8);
    }
  }
  return;
}

Assistant:

void SmodelsInput::matchSum(RuleBuilder& rule, bool weights) {
	uint32_t bnd = matchPos();
	uint32_t len = matchPos();
	uint32_t neg = matchPos();
	if (!weights) { std::swap(len, bnd); std::swap(bnd, neg); }
	rule.startSum(bnd);
	for (uint32_t i = 0; i != len; ++i) {
		Lit_t p = lit(matchAtom());
		if (neg) { p *= -1; --neg; }
		rule.addGoal(p, 1);
	}
	if (weights) {
		for (WeightLit_t* x = rule.wlits_begin(), *end = x + len; x != end; ++x) {
			x->weight = (Weight_t)matchPos("non-negative weight expected");
		}
	}
}